

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::tinyBLAS_Q0_AVX<block_q4_0,block_q8_0,float>::gemm<3,3>
          (tinyBLAS_Q0_AVX<block_q4_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m256 c;
  __m256 x;
  __m256i s;
  __m256 b;
  __m256i u;
  __m256 a;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  __m256i *in_RDI;
  long in_R8;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [60];
  int64_t i_1;
  int64_t j_1;
  __m256 udTmp;
  int64_t i;
  int64_t j;
  int64_t l;
  __m256 Cv [3] [3];
  int64_t jj;
  int64_t ii;
  int64_t job;
  int64_t end;
  int64_t start;
  int64_t duty;
  int64_t tiles;
  int64_t xtiles;
  int64_t ytiles;
  undefined8 in_stack_fffffffffffffc60;
  block_q4_0 *in_stack_fffffffffffffc68;
  tinyBLAS_Q0_AVX<block_q4_0,_block_q8_0,_float> *in_stack_fffffffffffffc70;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  longlong lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  longlong lVar12;
  float in_stack_fffffffffffffcd0;
  float in_stack_fffffffffffffcd4;
  long local_310;
  long local_308;
  long local_2d8;
  block_q8_0 *local_2d0;
  long local_2c8;
  undefined1 local_2c0 [304];
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_140;
  long local_130;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  longlong lStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined8 local_c0;
  block_q4_0 *pbStack_b8;
  tinyBLAS_Q0_AVX<block_q4_0,_block_q8_0,_float> *ptStack_b0;
  undefined8 uStack_a8;
  float local_84;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_150 = (in_RDX - in_RSI) / 3;
  local_158 = (in_R8 - in_RCX) / 3;
  local_160 = local_158 * local_150;
  local_168 = (local_160 + *(int *)((long)in_RDI[1] + 0x1c) + -1) /
              (long)*(int *)((long)in_RDI[1] + 0x1c);
  local_180 = local_168 * (int)in_RDI[1][3];
  local_178 = local_180 + local_168;
  local_170 = local_180;
  local_140 = in_RCX;
  local_130 = in_RSI;
  if (local_160 < local_180 + local_168) {
    local_178 = local_160;
  }
  for (; local_180 < local_178; local_180 = local_180 + 1) {
    local_188 = local_130 + (local_180 / local_158) * 3;
    local_190 = local_140 + (local_180 % local_158) * 3;
    in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
    memset(local_2c0,0,0x120);
    for (local_2c8 = 0; local_2c8 < (*in_RDI)[3]; local_2c8 = local_2c8 + 1) {
      for (local_2d0 = (block_q8_0 *)0x0; (long)local_2d0 < 3;
          local_2d0 = (block_q8_0 *)((long)&local_2d0->d + 1)) {
        for (local_2d8 = 0; auVar3 = in_ZMM0._0_32_, local_2d8 < 3; local_2d8 = local_2d8 + 1) {
          anon_unknown.dwarf_4bce2::tinyBLAS_Q0_AVX<block_q4_0,_block_q8_0,_float>::load
                    (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          in_stack_fffffffffffffc60 = auVar3._0_8_;
          in_stack_fffffffffffffc68 = auVar3._8_8_;
          in_stack_fffffffffffffc70 = auVar3._16_8_;
          uVar5 = auVar3._24_8_;
          anon_unknown.dwarf_4bce2::tinyBLAS_Q0_AVX<block_q4_0,_block_q8_0,_float>::load
                    (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          auVar4._8_8_ = in_stack_fffffffffffffc68;
          auVar4._0_8_ = in_stack_fffffffffffffc60;
          auVar4._16_8_ = in_stack_fffffffffffffc70;
          auVar4._24_8_ = uVar5;
          auVar4 = vpsignb_avx2(auVar4,auVar3);
          uVar10 = auVar4._0_8_;
          uVar11 = auVar4._8_8_;
          lVar12 = auVar4._16_8_;
          local_e0 = auVar3;
          local_c0 = in_stack_fffffffffffffc60;
          pbStack_b8 = in_stack_fffffffffffffc68;
          ptStack_b0 = in_stack_fffffffffffffc70;
          uStack_a8 = uVar5;
          anon_unknown.dwarf_4bce2::tinyBLAS_Q0_AVX<block_q4_0,_block_q8_0,_float>::load
                    (in_RDI,(tinyBLAS_Q0_AVX<block_q4_0,_block_q8_0,_float> *)
                            ((*in_RDI)[1] +
                             in_RDI[1][1] * (long)(local_2d0->qs + local_190 + -2) * 0x22 +
                            local_2c8 * 0x22),local_2d0);
          uVar6 = auVar4._0_8_;
          uVar7 = auVar4._8_8_;
          lVar8 = auVar4._16_8_;
          uVar9 = auVar4._24_8_;
          anon_unknown.dwarf_4bce2::tinyBLAS_Q0_AVX<block_q4_0,_block_q8_0,_float>::load
                    (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          auVar3._8_8_ = uVar7;
          auVar3._0_8_ = uVar6;
          auVar3._16_8_ = lVar8;
          auVar3._24_8_ = uVar9;
          vpsignb_avx2(auVar3,auVar4);
          u[1] = uVar10;
          u[0] = uVar9;
          u[2] = uVar11;
          u[3] = lVar12;
          s[1] = uVar6;
          s[0] = uVar5;
          s[2] = uVar7;
          s[3] = lVar8;
          local_120 = auVar4;
          local_100 = uVar6;
          uStack_f8 = uVar7;
          lStack_f0 = lVar8;
          uStack_e8 = uVar9;
          anon_unknown.dwarf_4bce2::tinyBLAS_Q0_AVX<block_q4_0,_block_q8_0,_float>::updot
                    ((tinyBLAS_Q0_AVX<block_q4_0,_block_q8_0,_float> *)
                     CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),u,s);
          in_stack_fffffffffffffcd0 = anon_unknown.dwarf_4bce2::unhalf(0);
          in_stack_fffffffffffffcd4 = anon_unknown.dwarf_4bce2::unhalf(0);
          in_stack_fffffffffffffcd4 = in_stack_fffffffffffffcd0 * in_stack_fffffffffffffcd4;
          auVar1 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffffcd4),
                                 ZEXT416((uint)in_stack_fffffffffffffcd4),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)in_stack_fffffffffffffcd4),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)in_stack_fffffffffffffcd4),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)in_stack_fffffffffffffcd4),
                                 ZEXT416((uint)in_stack_fffffffffffffcd4),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)in_stack_fffffffffffffcd4),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)in_stack_fffffffffffffcd4),0x30);
          local_80._16_16_ = auVar1;
          local_80._0_16_ = auVar2;
          in_ZMM0 = ZEXT3264(local_80);
          a[2] = (float)(int)uVar10;
          a[3] = (float)(int)((ulong)uVar10 >> 0x20);
          a[0] = (float)(int)uVar9;
          a[1] = (float)(int)((ulong)uVar9 >> 0x20);
          a[4] = (float)(int)uVar11;
          a[5] = (float)(int)((ulong)uVar11 >> 0x20);
          a[6] = (float)(int)lVar12;
          a[7] = (float)(int)((ulong)lVar12 >> 0x20);
          b[2] = (float)(int)uVar6;
          b[3] = (float)(int)((ulong)uVar6 >> 0x20);
          b[0] = (float)(int)uVar5;
          b[1] = (float)(int)((ulong)uVar5 >> 0x20);
          b[4] = (float)(int)uVar7;
          b[5] = (float)(int)((ulong)uVar7 >> 0x20);
          b[6] = (float)(int)lVar8;
          b[7] = (float)(int)((ulong)lVar8 >> 0x20);
          c[2] = (float)(int)in_stack_fffffffffffffc60;
          c[3] = (float)(int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
          c[0] = 2.705606e-39;
          c[1] = 0.0;
          c._16_8_ = in_stack_fffffffffffffc68;
          c._24_8_ = in_stack_fffffffffffffc70;
          local_84 = in_stack_fffffffffffffcd4;
          local_50 = in_stack_fffffffffffffcd4;
          local_4c = in_stack_fffffffffffffcd4;
          local_48 = in_stack_fffffffffffffcd4;
          local_44 = in_stack_fffffffffffffcd4;
          local_40 = in_stack_fffffffffffffcd4;
          local_3c = in_stack_fffffffffffffcd4;
          local_38 = in_stack_fffffffffffffcd4;
          local_34 = in_stack_fffffffffffffcd4;
          madd<float__vector(8),float__vector(8)>(a,b,c);
          *(undefined1 (*) [32])(local_2c0 + local_2d8 * 0x20 + (long)local_2d0 * 0x60) =
               in_ZMM0._0_32_;
        }
      }
    }
    for (local_308 = 0; local_308 < 3; local_308 = local_308 + 1) {
      for (local_310 = 0; local_310 < 3; local_310 = local_310 + 1) {
        x[2] = (float)(int)in_stack_fffffffffffffc60;
        x[3] = (float)(int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
        x[0] = 2.705909e-39;
        x[1] = 0.0;
        x._16_8_ = in_stack_fffffffffffffc68;
        x._24_8_ = in_stack_fffffffffffffc70;
        in_ZMM0._0_4_ = anon_unknown.dwarf_4bce2::hsum(x);
        in_ZMM0._4_60_ = extraout_var;
        *(float *)((*in_RDI)[2] +
                  (in_RDI[1][2] * (local_190 + local_308) + local_188 + local_310) * 4) =
             in_ZMM0._0_4_;
      }
    }
  }
  return;
}

Assistant:

NOINLINE void gemm(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][RM] = {};
            for (int64_t l = 0; l < k; ++l)
                for (int64_t j = 0; j < RN; ++j)
                    for (int64_t i = 0; i < RM; ++i) {
#if defined(__AVX2__)
                        __m256 udTmp = updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                              load(A + lda * (ii + i) + l)),
                                             _mm256_sign_epi8(load(B + ldb * (jj + j) + l),
                                                              load(A + lda * (ii + i) + l)));
#else
                        __m128i ali0 = load0(A + lda * (ii + i) + l);
                        __m128i ali1 = load1(A + lda * (ii + i) + l);
                        __m128i blj0 = load0(B + ldb * (jj + j) + l);
                        __m128i blj1 = load1(B + ldb * (jj + j) + l);

                        __m128i sepAA0 = _mm_sign_epi8(ali0, ali0);
                        __m128i sepAA1 = _mm_sign_epi8(ali1, ali1);
                        __m128i sepBA0 = _mm_sign_epi8(blj0, ali0);
                        __m128i sepBA1 = _mm_sign_epi8(blj1, ali1);

                        // updot
                        const __m128i oneFill = _mm_set1_epi16(1);
                        __m128i mad0 = _mm_maddubs_epi16(sepAA0, sepBA0);
                        __m128i mad1 = _mm_maddubs_epi16(sepAA1, sepBA1);
                        __m256 udTmp = _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_madd_epi16(oneFill, mad1), _mm_madd_epi16(oneFill, mad0)));
#endif
                        Cv[j][i] = madd(_mm256_set1_ps(unhalf(A[lda * (ii + i) + l].d) *
                                                       unhalf(B[ldb * (jj + j) + l].d)),
                                                       udTmp,
                                                       Cv[j][i]);
                    }
            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }